

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_bool32
drwav_init_memory_ex
          (drwav *pWav,void *data,size_t dataSize,drwav_chunk_proc onChunk,void *pChunkUserData,
          drwav_uint32 flags,drwav_allocation_callbacks *pAllocationCallbacks)

{
  drwav_bool32 dVar1;
  
  if (dataSize != 0 && data != (void *)0x0) {
    dVar1 = drwav_preinit(pWav,drwav__on_read_memory,drwav__on_seek_memory,pWav,pAllocationCallbacks
                         );
    if (dVar1 != 0) {
      (pWav->memoryStream).data = (drwav_uint8 *)data;
      (pWav->memoryStream).dataSize = dataSize;
      (pWav->memoryStream).currentReadPos = 0;
      dVar1 = drwav_init__internal(pWav,onChunk,pChunkUserData,flags);
      return dVar1;
    }
  }
  return 0;
}

Assistant:

DRWAV_API drwav_bool32 drwav_init_memory_ex(drwav* pWav, const void* data, size_t dataSize, drwav_chunk_proc onChunk, void* pChunkUserData, drwav_uint32 flags, const drwav_allocation_callbacks* pAllocationCallbacks)
{
    if (data == NULL || dataSize == 0) {
        return DRWAV_FALSE;
    }

    if (!drwav_preinit(pWav, drwav__on_read_memory, drwav__on_seek_memory, pWav, pAllocationCallbacks)) {
        return DRWAV_FALSE;
    }

    pWav->memoryStream.data = (const drwav_uint8*)data;
    pWav->memoryStream.dataSize = dataSize;
    pWav->memoryStream.currentReadPos = 0;

    return drwav_init__internal(pWav, onChunk, pChunkUserData, flags);
}